

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidiin.cpp
# Opt level: O0

void anon_unknown.dwarf_fc12::RtMidiInCustomCallback
               (double timeStamp,vector<unsigned_char,_std::allocator<unsigned_char>_> *message,
               void *userData)

{
  _Base_ptr p_Var1;
  bool bVar2;
  size_type sVar3;
  pointer ppVar4;
  reference pvVar5;
  ulong local_48;
  size_t i;
  size_type n;
  _Self local_30;
  iterator it;
  RtMidiIn_callback_rec *rec;
  void *userData_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *message_local;
  double timeStamp_local;
  
  it._M_node = (_Base_ptr)userData;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::pair<RtMidiIn_*,_lua_State_*>,_int,_std::less<std::pair<RtMidiIn_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidiIn_*,_lua_State_*>,_int>_>_>
       ::find((map<std::pair<RtMidiIn_*,_lua_State_*>,_int,_std::less<std::pair<RtMidiIn_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidiIn_*,_lua_State_*>,_int>_>_>
               *)(anonymous_namespace)::RtMidiIn_callbacks,(key_type *)userData);
  n = (size_type)
      std::
      map<std::pair<RtMidiIn_*,_lua_State_*>,_int,_std::less<std::pair<RtMidiIn_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidiIn_*,_lua_State_*>,_int>_>_>
      ::end((map<std::pair<RtMidiIn_*,_lua_State_*>,_int,_std::less<std::pair<RtMidiIn_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidiIn_*,_lua_State_*>,_int>_>_>
             *)(anonymous_namespace)::RtMidiIn_callbacks);
  bVar2 = std::operator==(&local_30,(_Self *)&n);
  if (bVar2) {
    std::operator<<((ostream *)&std::cerr,"RtMidiIn instance not found!\n");
  }
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(message);
  p_Var1 = (it._M_node)->_M_parent;
  ppVar4 = std::_Rb_tree_iterator<std::pair<const_std::pair<RtMidiIn_*,_lua_State_*>,_int>_>::
           operator->(&local_30);
  lua_rawgeti(p_Var1,0xffffd8f0,ppVar4->second);
  lua_pushnumber(timeStamp,(it._M_node)->_M_parent);
  lua_createtable((it._M_node)->_M_parent,sVar3 & 0xffffffff,0);
  for (local_48 = 0; local_48 < sVar3; local_48 = local_48 + 1) {
    p_Var1 = (it._M_node)->_M_parent;
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (message,local_48);
    lua_pushinteger(p_Var1,*pvVar5);
    lua_rawseti((it._M_node)->_M_parent,0xfffffffe,(int)local_48 + 1);
  }
  lua_call((it._M_node)->_M_parent,2,0);
  return;
}

Assistant:

void RtMidiInCustomCallback(double timeStamp, std::vector<unsigned char> *message, void *userData) {
	auto *rec = reinterpret_cast<RtMidiIn_callback_rec *>(userData);
	auto it = RtMidiIn_callbacks.find(*rec);
	if (it == RtMidiIn_callbacks.end())
		std::cerr << "RtMidiIn instance not found!\n";
	auto n = message->size();

	lua_rawgeti(rec->second, LUA_REGISTRYINDEX, it->second); // RtMidiIn_callbackwrapper
	lua_pushnumber(rec->second, timeStamp);
	lua_createtable(rec->second, n, 0);
	for (std::size_t i = 0; i < n; ++i) {
		lua_pushinteger(rec->second, (*message)[i]);
		lua_rawseti(rec->second, -2, i + 1);
	}
	lua_call(rec->second, 2, 0);
}